

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

IntersectClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntersectClauseSyntax,slang::syntax::IntersectClauseSyntax_const&>
          (BumpAllocator *this,IntersectClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  RangeListSyntax *pRVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  IntersectClauseSyntax *pIVar10;
  
  pIVar10 = (IntersectClauseSyntax *)allocate(this,0x30,8);
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar6 = (args->intersect).kind;
  uVar7 = (args->intersect).field_0x2;
  NVar8.raw = (args->intersect).numFlags.raw;
  uVar9 = (args->intersect).rawLen;
  pIVar3 = (args->intersect).info;
  pRVar4 = (args->ranges).ptr;
  (pIVar10->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pIVar10->super_SyntaxNode).field_0x4 = uVar5;
  (pIVar10->super_SyntaxNode).parent = pSVar1;
  (pIVar10->super_SyntaxNode).previewNode = pSVar2;
  (pIVar10->intersect).kind = TVar6;
  (pIVar10->intersect).field_0x2 = uVar7;
  (pIVar10->intersect).numFlags = (NumericTokenFlags)NVar8.raw;
  (pIVar10->intersect).rawLen = uVar9;
  (pIVar10->intersect).info = pIVar3;
  (pIVar10->ranges).ptr = pRVar4;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }